

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_4_part_ctx_and_rdcost
               (MACROBLOCK *x,AV1_COMP *cpi,ThreadData_conflict *td,PICK_MODE_CONTEXT **cur_part_ctx
               ,PartitionSearchState *part_search_state,PARTITION_TYPE partition_type,
               BLOCK_SIZE bsize)

{
  PICK_MODE_CONTEXT *pPVar1;
  long in_RCX;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  PART4_TYPES i;
  int subsize;
  PC_TREE_SHARED_BUFFERS *in_stack_00000198;
  BLOCK_SIZE in_stack_000001a7;
  AV1_COMP *in_stack_000001a8;
  byte local_31;
  PARTITION_TYPE in_stack_ffffffffffffffd5;
  BLOCK_SIZE in_stack_ffffffffffffffd6;
  
  av1_init_rd_stats((RD_STATS *)(in_R8 + 0x80));
  get_partition_subsize(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd5);
  *(undefined4 *)(in_R8 + 0x80) = *(undefined4 *)(*(long *)(in_R8 + 0xb8) + (ulong)in_R9B * 4);
  *(long *)(in_R8 + 0x90) =
       (long)*(int *)(in_R8 + 0x80) * (long)*(int *)(in_RDI + 0x4218) + 0x100 >> 9;
  for (local_31 = 0; local_31 < 4; local_31 = local_31 + 1) {
    pPVar1 = av1_alloc_pmc(in_stack_000001a8,in_stack_000001a7,in_stack_00000198);
    *(PICK_MODE_CONTEXT **)(in_RCX + (ulong)local_31 * 8) = pPVar1;
    if (*(long *)(in_RCX + (ulong)local_31 * 8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  return;
}

Assistant:

static void set_4_part_ctx_and_rdcost(
    MACROBLOCK *x, const AV1_COMP *const cpi, ThreadData *td,
    PICK_MODE_CONTEXT *cur_part_ctx[SUB_PARTITIONS_PART4],
    PartitionSearchState *part_search_state, PARTITION_TYPE partition_type,
    BLOCK_SIZE bsize) {
  // Initialize sum_rdc RD cost structure.
  av1_init_rd_stats(&part_search_state->sum_rdc);
  const int subsize = get_partition_subsize(bsize, partition_type);
  part_search_state->sum_rdc.rate =
      part_search_state->partition_cost[partition_type];
  part_search_state->sum_rdc.rdcost =
      RDCOST(x->rdmult, part_search_state->sum_rdc.rate, 0);
  for (PART4_TYPES i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    cur_part_ctx[i] = av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
    if (!cur_part_ctx[i])
      aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  }
}